

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynIfElse * ParseIfElse(ParseContext *ctx,bool forceStaticIf)

{
  Lexeme *begin;
  SynVariableDefinition *pSVar1;
  int iVar2;
  SynBase *pSVar3;
  SynVariableDefinition *pSVar4;
  undefined4 extraout_var;
  Lexeme *pLVar5;
  SynBase *this;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SynIfElse *falseBlock;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  LexemeType LVar6;
  undefined7 in_register_00000031;
  bool forceStaticIf_00;
  IntrusiveList<SynVariableDefinition> definitions;
  
  begin = ctx->currentLexeme;
  LVar6 = begin->type;
  pLVar5 = begin;
  if ((int)CONCAT71(in_register_00000031,forceStaticIf) == 0) {
    forceStaticIf_00 = LVar6 == lex_at;
    if (forceStaticIf_00) {
      if (begin[1].type != lex_if) {
        return (SynIfElse *)0x0;
      }
      pLVar5 = begin + 1;
    }
    else {
      forceStaticIf_00 = false;
      if (LVar6 != lex_if) {
        return (SynIfElse *)0x0;
      }
    }
  }
  else {
    forceStaticIf_00 = true;
    if (LVar6 != lex_if) {
      return (SynIfElse *)0x0;
    }
  }
  ctx->currentLexeme = pLVar5 + 1;
  anon_unknown.dwarf_153727::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' not found after \'if\'");
  if (forceStaticIf_00 == false) {
    pLVar5 = ctx->currentLexeme;
    pSVar3 = ParseType(ctx,(bool *)0x0,false);
    if (pSVar3 == (SynBase *)0x0) goto LAB_001fb5a5;
    definitions.head = (SynVariableDefinition *)0x0;
    definitions.tail = (SynVariableDefinition *)0x0;
    pSVar4 = ParseVariableDefinition(ctx);
    if (pSVar4 == (SynVariableDefinition *)0x0) {
      ctx->currentLexeme = pLVar5;
      goto LAB_001fb5a5;
    }
    IntrusiveList<SynVariableDefinition>::push_back(&definitions,pSVar4);
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    this = (SynBase *)CONCAT44(extraout_var,iVar2);
    pLVar5 = ParseContext::Previous(ctx);
    pSVar1 = definitions.tail;
    pSVar4 = definitions.head;
    SynBase::SynBase(this,0x34,begin,pLVar5);
    this->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e4e70;
    this[1]._vptr_SynBase = (_func_int **)0x0;
    *(SynBase **)&this[1].typeID = pSVar3;
    this[1].begin = (Lexeme *)pSVar4;
    this[1].end = (Lexeme *)pSVar1;
  }
  else {
LAB_001fb5a5:
    this = ParseAssignment(ctx);
    if (this == (SynBase *)0x0) {
      anon_unknown.dwarf_153727::Report
                (ctx,ctx->currentLexeme,"ERROR: condition not found in \'if\' statement");
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      this = (SynBase *)CONCAT44(extraout_var_00,iVar2);
      SynError::SynError((SynError *)this,ctx->currentLexeme,ctx->currentLexeme);
    }
  }
  anon_unknown.dwarf_153727::CheckConsume
            (ctx,lex_cparen,"ERROR: closing \')\' not found after \'if\' condition");
  pSVar3 = ParseExpression(ctx);
  if (pSVar3 == (SynBase *)0x0) {
    anon_unknown.dwarf_153727::Report
              (ctx,ctx->currentLexeme,"ERROR: expression not found after \'if\'");
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pSVar3 = (SynBase *)CONCAT44(extraout_var_01,iVar2);
    SynError::SynError((SynError *)pSVar3,ctx->currentLexeme,ctx->currentLexeme);
  }
  pLVar5 = ctx->currentLexeme;
  if (forceStaticIf_00 != false) {
    LVar6 = pLVar5->type;
    if (LVar6 != lex_semicolon) goto LAB_001fb673;
    pLVar5 = pLVar5 + 1;
    ctx->currentLexeme = pLVar5;
  }
  LVar6 = pLVar5->type;
LAB_001fb673:
  if (LVar6 == lex_else) {
    ctx->currentLexeme = pLVar5 + 1;
    if (pLVar5[1].type == lex_if) {
      falseBlock = ParseIfElse(ctx,forceStaticIf_00);
    }
    else {
      falseBlock = (SynIfElse *)ParseExpression(ctx);
    }
    if (falseBlock == (SynIfElse *)0x0) {
      anon_unknown.dwarf_153727::Report
                (ctx,ctx->currentLexeme,"ERROR: expression not found after \'else\'");
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      falseBlock = (SynIfElse *)CONCAT44(extraout_var_02,iVar2);
      SynError::SynError((SynError *)falseBlock,ctx->currentLexeme,ctx->currentLexeme);
    }
    if ((forceStaticIf_00 != false) && (ctx->currentLexeme->type == lex_semicolon)) {
      ctx->currentLexeme = ctx->currentLexeme + 1;
    }
  }
  else {
    falseBlock = (SynIfElse *)0x0;
  }
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
  pLVar5 = ParseContext::Previous(ctx);
  SynIfElse::SynIfElse
            ((SynIfElse *)CONCAT44(extraout_var_03,iVar2),begin,pLVar5,forceStaticIf_00,this,pSVar3,
             &falseBlock->super_SynBase);
  return (SynIfElse *)CONCAT44(extraout_var_03,iVar2);
}

Assistant:

SynIfElse* ParseIfElse(ParseContext &ctx, bool forceStaticIf)
{
	Lexeme *start = ctx.currentLexeme;

	bool staticIf = forceStaticIf || ctx.Consume(lex_at);

	if(ctx.Consume(lex_if))
	{
		CheckConsume(ctx, lex_oparen, "ERROR: '(' not found after 'if'");

		Lexeme *conditionPos = ctx.currentLexeme;

		SynBase *condition = NULL;

		if(!staticIf)
		{
			if(SynBase *type = ParseType(ctx))
			{
				IntrusiveList<SynVariableDefinition> definitions;

				if(SynVariableDefinition *definition = ParseVariableDefinition(ctx))
				{
					definitions.push_back(definition);

					condition = new (ctx.get<SynVariableDefinitions>()) SynVariableDefinitions(start, ctx.Previous(), NULL, type, definitions);
				}
				else
				{
					ctx.currentLexeme = conditionPos;
				}
			}
		}

		if(!condition)
			condition = ParseAssignment(ctx);

		if(!condition)
		{
			Report(ctx, ctx.Current(), "ERROR: condition not found in 'if' statement");

			condition = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: closing ')' not found after 'if' condition");

		SynBase *trueBlock = ParseExpression(ctx);

		if(!trueBlock)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after 'if'");

			trueBlock = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		SynBase *falseBlock = NULL;

		if(staticIf && ctx.At(lex_semicolon))
			ctx.Skip();

		if(ctx.Consume(lex_else))
		{
			if(ctx.At(lex_if))
				falseBlock = ParseIfElse(ctx, staticIf);
			else
				falseBlock = ParseExpression(ctx);

			if(!falseBlock)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after 'else'");

				falseBlock = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}

			if(staticIf && ctx.At(lex_semicolon))
				ctx.Skip();
		}

		return new (ctx.get<SynIfElse>()) SynIfElse(start, ctx.Previous(), staticIf, condition, trueBlock, falseBlock);
	}

	if(staticIf)
	{
		// Backtrack
		ctx.currentLexeme = start;
	}

	return NULL;
}